

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

void Assimp::IFC::MakeDisjunctWindowContours
               (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *a,
               vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *b,ExPolygons *out)

{
  pointer paVar1;
  double dVar2;
  IntPoint *pIVar3;
  long64 lVar4;
  bool bVar5;
  IntPoint *pIVar6;
  IntPoint *pIVar7;
  IfcVector2 *pip;
  pointer paVar8;
  IfcVector2 *pip_1;
  Polygon clip;
  Clipper clipper;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_128;
  IntPoint local_108;
  ExPolygons *local_f8;
  Clipper local_f0;
  
  local_f8 = out;
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::_M_erase_at_end
            (out,(out->
                 super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>).
                 _M_impl.super__Vector_impl_data._M_start);
  ClipperLib::Clipper::Clipper(&local_f0);
  local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (IntPoint *)0x0;
  local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (IntPoint *)0x0;
  local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
  paVar8 = (a->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  paVar1 = (a->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (paVar8 != paVar1) {
    do {
      dVar2 = paVar8->x * 1518500249.0;
      local_108.X = (long64)dVar2;
      local_108.X = (long)(dVar2 - 9.223372036854776e+18) & local_108.X >> 0x3f | local_108.X;
      dVar2 = paVar8->y * 1518500249.0;
      local_108.Y = (long64)dVar2;
      local_108.Y = (long)(dVar2 - 9.223372036854776e+18) & local_108.Y >> 0x3f | local_108.Y;
      if (local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        _M_realloc_insert<ClipperLib::IntPoint>
                  (&local_128,
                   (iterator)
                   local_128.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_108);
      }
      else {
        (local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->X = local_108.X;
        (local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->Y = local_108.Y;
        local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_128.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
      paVar8 = paVar8 + 1;
    } while (paVar8 != paVar1);
  }
  bVar5 = ClipperLib::Orientation(&local_128);
  if ((bVar5) &&
     (pIVar7 = local_128.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1,
     pIVar3 = local_128.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start,
     local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_start < pIVar7 &&
     local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_start !=
     local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    do {
      pIVar6 = pIVar3 + 1;
      local_108.X = pIVar3->X;
      local_108.Y = pIVar3->Y;
      lVar4 = pIVar7->Y;
      pIVar3->X = pIVar7->X;
      pIVar3->Y = lVar4;
      pIVar7->X = local_108.X;
      pIVar7->Y = local_108.Y;
      pIVar7 = pIVar7 + -1;
      pIVar3 = pIVar6;
    } while (pIVar6 < pIVar7);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)(local_f0._vptr_Clipper[-3] + (long)&local_f0),&local_128,ptClip);
  if (local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  paVar8 = (b->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  paVar1 = (b->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (paVar8 != paVar1) {
    do {
      dVar2 = paVar8->x * 1518500249.0;
      local_108.X = (long64)dVar2;
      local_108.X = (long)(dVar2 - 9.223372036854776e+18) & local_108.X >> 0x3f | local_108.X;
      dVar2 = paVar8->y * 1518500249.0;
      local_108.Y = (long64)dVar2;
      local_108.Y = (long)(dVar2 - 9.223372036854776e+18) & local_108.Y >> 0x3f | local_108.Y;
      if (local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        _M_realloc_insert<ClipperLib::IntPoint>
                  (&local_128,
                   (iterator)
                   local_128.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_108);
      }
      else {
        (local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->X = local_108.X;
        (local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->Y = local_108.Y;
        local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_128.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
      paVar8 = paVar8 + 1;
    } while (paVar8 != paVar1);
  }
  bVar5 = ClipperLib::Orientation(&local_128);
  if ((bVar5) &&
     (pIVar7 = local_128.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1,
     pIVar3 = local_128.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start,
     local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_start < pIVar7 &&
     local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_start !=
     local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    do {
      pIVar6 = pIVar3 + 1;
      local_108.X = pIVar3->X;
      local_108.Y = pIVar3->Y;
      lVar4 = pIVar7->Y;
      pIVar3->X = pIVar7->X;
      pIVar3->Y = lVar4;
      pIVar7->X = local_108.X;
      pIVar7->Y = local_108.Y;
      pIVar7 = pIVar7 + -1;
      pIVar3 = pIVar6;
    } while (pIVar6 < pIVar7);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)(local_f0._vptr_Clipper[-3] + (long)&local_f0._vptr_Clipper),&local_128,
             ptSubject);
  ClipperLib::Clipper::Execute(&local_f0,ctDifference,local_f8,pftNonZero,pftNonZero);
  if (local_128.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start != (IntPoint *)0x0) {
    operator_delete(local_128.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ClipperLib::Clipper::~Clipper(&local_f0);
  return;
}

Assistant:

void MakeDisjunctWindowContours (const std::vector<IfcVector2>& a,
    const std::vector<IfcVector2>& b,
    ClipperLib::ExPolygons& out)
{
    out.clear();

    ClipperLib::Clipper clipper;
    ClipperLib::Polygon clip;

    for(const IfcVector2& pip : a) {
        clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    if (ClipperLib::Orientation(clip)) {
        std::reverse(clip.begin(), clip.end());
    }

    clipper.AddPolygon(clip, ClipperLib::ptClip);
    clip.clear();

    for(const IfcVector2& pip : b) {
        clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    if (ClipperLib::Orientation(clip)) {
        std::reverse(clip.begin(), clip.end());
    }

    clipper.AddPolygon(clip, ClipperLib::ptSubject);
    clipper.Execute(ClipperLib::ctDifference, out,ClipperLib::pftNonZero,ClipperLib::pftNonZero);
}